

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void writeString(char *out,int i,QByteArray *str,int offsetOfStringdataMember,int *stringdataOffset)

{
  long lVar1;
  int iVar2;
  char *__src;
  ulong uVar3;
  
  lVar1 = (str->d).size;
  uVar3 = (long)offsetOfStringdataMember + (long)*stringdataOffset;
  *(ulong *)(out + (long)(i * 2) * 4) = uVar3 & 0xffffffff | lVar1 << 0x20;
  __src = (str->d).ptr;
  if (__src == (char *)0x0) {
    __src = &QByteArray::_empty;
  }
  iVar2 = (int)lVar1;
  memcpy(out + uVar3,__src,(long)iVar2);
  out[(int)uVar3 + iVar2] = '\0';
  *stringdataOffset = *stringdataOffset + iVar2 + 1;
  return;
}

Assistant:

static void writeString(char *out, int i, const QByteArray &str,
                        const int offsetOfStringdataMember, int &stringdataOffset)
{
    int size = str.size();
    int offset = offsetOfStringdataMember + stringdataOffset;
    uint offsetLen[2] = { uint(offset), uint(size) };

    memcpy(out + 2 * i * sizeof(uint), &offsetLen, 2 * sizeof(uint));

    memcpy(out + offset, str.constData(), size);
    out[offset + size] = '\0';

    stringdataOffset += size + 1;
}